

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::SSLClient::check_host_name(SSLClient *this,char *pattern,size_t pattern_len)

{
  pointer pbVar1;
  size_t __n;
  size_type sVar2;
  undefined1 auVar3 [8];
  int iVar4;
  bool bVar5;
  const_iterator __begin1;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  undefined1 auStack_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pattern_components;
  
  if (((this->super_ClientImpl).host_._M_string_length == pattern_len) &&
     (iVar4 = std::__cxx11::string::compare((char *)&(this->super_ClientImpl).host_), iVar4 == 0)) {
    bVar5 = true;
  }
  else {
    local_68._M_unused._M_object = auStack_48;
    auStack_48 = (undefined1  [8])0x0;
    pattern_components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pattern_components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._8_8_ = 0;
    pcStack_50 = std::
                 _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:7847:13)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:7847:13)>
               ::_M_manager;
    detail::split(pattern,pattern + pattern_len,'.',
                  (function<void_(const_char_*,_const_char_*)> *)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
    }
    pbVar6 = (this->host_components_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->host_components_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    auVar3 = auStack_48;
    if ((long)pbVar1 - (long)pbVar6 ==
        (long)pattern_components.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) {
      while ((bVar5 = pbVar6 == pbVar1, !bVar5 &&
             ((((__n = ((pointer)auVar3)->_M_string_length, __n == pbVar6->_M_string_length &&
                ((__n == 0 ||
                 (iVar4 = bcmp((((pointer)auVar3)->_M_dataplus)._M_p,(pbVar6->_M_dataplus)._M_p,__n)
                 , iVar4 == 0)))) ||
               (iVar4 = std::__cxx11::string::compare((char *)auVar3), iVar4 == 0)) ||
              (((sVar2 = ((pointer)auVar3)->_M_string_length, sVar2 != 0 &&
                ((((pointer)auVar3)->_M_dataplus)._M_p[sVar2 - 1] == '*')) &&
               (iVar4 = std::__cxx11::string::compare((ulong)auVar3,0,(string *)(sVar2 - 1)),
               iVar4 == 0))))))) {
        pbVar6 = pbVar6 + 1;
        auVar3 = (undefined1  [8])((long)auVar3 + 0x20);
      }
    }
    else {
      bVar5 = false;
    }
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_48);
  }
  return bVar5;
}

Assistant:

inline bool SSLClient::check_host_name(const char* pattern,
        size_t pattern_len) const {
        if (host_.size() == pattern_len && host_ == pattern) { return true; }

        // Wildcard match
        // https://bugs.launchpad.net/ubuntu/+source/firefox-3.0/+bug/376484
        std::vector<std::string> pattern_components;
        detail::split(&pattern[0], &pattern[pattern_len], '.',
            [&](const char* b, const char* e) {
            pattern_components.emplace_back(std::string(b, e));
        });

        if (host_components_.size() != pattern_components.size()) { return false; }

        auto itr = pattern_components.begin();
        for (const auto& h : host_components_) {
            auto& p = *itr;
            if (p != h && p != "*") {
                auto partial_match = (p.size() > 0 && p[p.size() - 1] == '*' &&
                    !p.compare(0, p.size() - 1, h));
                if (!partial_match) { return false; }
            }
            ++itr;
        }

        return true;
    }